

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O3

bool ON_WildCardMatch(char *s,char *pattern)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  
  if (pattern == (char *)0x0) {
LAB_005b6b2d:
    if (s == (char *)0x0) {
LAB_005b6b4b:
      bVar4 = true;
    }
    else {
      bVar4 = *s == '\0';
    }
  }
  else {
    cVar3 = *pattern;
LAB_005b6adf:
    if (cVar3 == '\0') goto LAB_005b6b2d;
    if (cVar3 != '*') {
      do {
        if (cVar3 == '?') {
          if (*s == '\0') goto LAB_005b6b6f;
        }
        else {
          if (cVar3 == '\\') {
            cVar2 = pattern[1];
            if ((cVar2 == '?') || (cVar2 == '*')) {
              pattern = pattern + 1;
              cVar3 = cVar2;
            }
          }
          else if (cVar3 == '*') goto LAB_005b6adf;
          if (cVar3 != *s) goto LAB_005b6b6f;
          if (cVar3 == '\0') goto LAB_005b6b4b;
        }
        s = s + 1;
        cVar3 = pattern[1];
        pattern = pattern + 1;
      } while( true );
    }
    do {
      pcVar1 = pattern + 1;
      pattern = pattern + 1;
    } while (*pcVar1 == '*');
    if (*pcVar1 == '\0') goto LAB_005b6b4b;
    if (*s == '\0') {
LAB_005b6b6f:
      bVar4 = false;
    }
    else {
      while (bVar4 = ON_WildCardMatch(s,pattern), !bVar4) {
        pcVar1 = s + 1;
        s = s + 1;
        if (*pcVar1 == '\0') {
          return bVar4;
        }
      }
    }
  }
  return bVar4;
}

Assistant:

bool ON_WildCardMatch(const char* s, const char* pattern)
{
  if ( !pattern || !pattern[0] ) {
    return ( !s || !s[0] ) ? true : false;
  }

  if ( *pattern == '*' ) {
    pattern++;
    while ( *pattern == '*' )
      pattern++;
    
    if ( !pattern[0] )
      return true;

    while (*s) {
      if ( ON_WildCardMatch(s,pattern) )
        return true;
      s++;
    }

    return false;
  }

  while ( *pattern != '*' )
  {
    if ( *pattern == '?' ) {
      if ( *s) {
        pattern++;
        s++;
        continue;
      }
      return false;
    }
    
    if ( *pattern == '\\' ) {
      switch( pattern[1] )
      {
      case '*':
      case '?':
        pattern++;
        break;
      }
    }
    if ( *pattern != *s ) {
      return false;
    }

    if ( *s == 0 )
      return true;

    pattern++;
    s++;
  }
  
  return ON_WildCardMatch(s,pattern);
}